

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O3

void tcmalloc::invoke_hooks_and_free(void *ptr)

{
  ThreadCache *this;
  void *pvVar1;
  Span *span;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 *in_FS_OFFSET;
  
  if (base::internal::delete_hooks_ != 0) {
    InvokeDeleteHookSlow(ptr);
  }
  this = (ThreadCache *)*in_FS_OFFSET;
  uVar3 = (ulong)ptr >> 0xd;
  uVar5 = *(ulong *)(Static::pageheap_ + (uVar3 & 0xffff) * 8 + 0x10) ^ uVar3 & 0xffffffffffff0000;
  if (0x7f < uVar5) {
    if ((((ulong)ptr >> 0x30 != 0) ||
        (*(long *)(Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010) == 0)) ||
       (span = *(Span **)(*(long *)(Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010) +
                         (ulong)((uint)uVar3 & 0x3ffff) * 8), span == (Span *)0x0))
    goto LAB_001107b3;
    uVar5 = (ulong)(byte)span->field_0x2a;
    if (uVar5 == 0) {
      anon_unknown.dwarf_510c::do_free_pages(span,ptr);
      return;
    }
    *(ulong *)(Static::pageheap_ + (uVar3 & 0xffff) * 8 + 0x10) = uVar3 & 0xffffffffffff0000 | uVar5
    ;
  }
  if (this != (ThreadCache *)0x0) {
    uVar3 = uVar5 & 0xffffffff;
    uVar4 = this->list_[uVar3].length_ + 1;
    pvVar1 = this->list_[uVar3].list_;
    this->list_[uVar3].list_ = ptr;
    *(void **)ptr = pvVar1;
    this->list_[uVar3].length_ = uVar4;
    if (this->list_[uVar3].max_length_ < uVar4) {
      ThreadCache::ListTooLong(this,this->list_ + uVar3,(uint32_t)uVar5);
      return;
    }
    iVar2 = this->size_ + this->list_[uVar3].size_;
    this->size_ = iVar2;
    if (iVar2 <= this->max_size_) {
      return;
    }
    ThreadCache::Scavenge(this);
    return;
  }
  if (Static::inited_ != '\0') {
    *(undefined8 *)ptr = 0;
    CentralFreeList::InsertRange
              ((CentralFreeList *)(&Static::central_cache_ + (uVar5 & 0xffffffff) * 0x130),ptr,ptr,1
              );
    return;
  }
LAB_001107b3:
  if (ptr == (void *)0x0) {
    return;
  }
  anon_unknown.dwarf_510c::InvalidFree(ptr);
  return;
}

Assistant:

static ATTRIBUTE_NOINLINE
void invoke_hooks_and_free(void *ptr) {
  tcmalloc::InvokeDeleteHook(ptr);
  do_free(ptr);
}